

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O0

int Cgt_SimulationFilter(Cgt_Man_t *p,Aig_Obj_t *pCandPart,Aig_Obj_t *pMiterPart)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  void *pvVar4;
  void *pvVar5;
  int local_3c;
  int nWords;
  int w;
  uint *pInfoMiter;
  uint *pInfoCand;
  Aig_Obj_t *pMiterPart_local;
  Aig_Obj_t *pCandPart_local;
  Cgt_Man_t *p_local;
  
  iVar2 = Abc_BitWordNum(p->nPatts);
  pVVar1 = p->vPatts;
  pObj = Aig_Regular(pCandPart);
  iVar3 = Aig_ObjId(pObj);
  pvVar4 = Vec_PtrEntry(pVVar1,iVar3);
  pVVar1 = p->vPatts;
  iVar3 = Aig_ObjId(pMiterPart);
  pvVar5 = Vec_PtrEntry(pVVar1,iVar3);
  iVar3 = Aig_IsComplement(pCandPart);
  if (iVar3 == 0) {
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      if ((*(uint *)((long)pvVar4 + (long)local_3c * 4) &
          *(uint *)((long)pvVar5 + (long)local_3c * 4)) != 0) {
        return 0;
      }
    }
  }
  else {
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      if (((*(uint *)((long)pvVar4 + (long)local_3c * 4) ^ 0xffffffff) &
          *(uint *)((long)pvVar5 + (long)local_3c * 4)) != 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Cgt_SimulationFilter( Cgt_Man_t * p, Aig_Obj_t * pCandPart, Aig_Obj_t * pMiterPart )
{
    unsigned * pInfoCand, * pInfoMiter;
    int w, nWords = Abc_BitWordNum( p->nPatts );  
    pInfoCand  = (unsigned *)Vec_PtrEntry( p->vPatts, Aig_ObjId(Aig_Regular(pCandPart)) );
    pInfoMiter = (unsigned *)Vec_PtrEntry( p->vPatts, Aig_ObjId(pMiterPart) );
    // C => !M -- true   is the same as    C & M -- false
    if ( !Aig_IsComplement(pCandPart) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( pInfoCand[w] & pInfoMiter[w] )
                return 0;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( ~pInfoCand[w] & pInfoMiter[w] )
                return 0;
    }
    return 1;
}